

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiceDriver.cpp
# Opt level: O2

bool test_DiceRoller_roll(void)

{
  DiceRoller *this;
  int y;
  ulong uVar1;
  int x;
  ulong uVar2;
  bool bVar3;
  vector<int,_std::allocator<int>_> outcome;
  
  this = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this);
  bVar3 = true;
  for (uVar2 = 1; uVar2 != 4; uVar2 = uVar2 + 1) {
    DiceRoller::roll(&outcome,this,(int)uVar2);
    if (bVar3) {
      bVar3 = uVar2 == ((ulong)((long)outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
    }
    else {
      bVar3 = false;
    }
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      if ((bVar3 == false) ||
         (5 < outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar1] - 1U)) {
        bVar3 = false;
      }
      else {
        bVar3 = *outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start <=
                outcome.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1];
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&outcome.super__Vector_base<int,_std::allocator<int>_>);
  }
  DiceRoller::~DiceRoller(this);
  operator_delete(this,0x10);
  return bVar3;
}

Assistant:

bool test_DiceRoller_roll() {
    bool success = true;
    auto* roller = new DiceRoller();

    for (int x = 1; x < 4; x++) {
        std::vector<int> outcome = roller->roll(x);

        success = success && x == (int) outcome.size();
        int prev = outcome[0];
        for (int y = 0; y < x; y++) {
            success = success && outcome[y] > 0 && outcome[y] < 7;
            success = success && prev <= outcome[y];
        }
    }

    delete (roller);

    return success;
}